

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  uint __line;
  int iVar1;
  int *piVar2;
  word wVar3;
  char *__assertion;
  ulong uVar4;
  word *pwVar5;
  
  if (vTemp->nSize == p->nObjs) {
    iVar1 = Gia_ObjIsLut(p,iObj);
    if (iVar1 != 0) {
      pwVar5 = s_Truths6;
      uVar4 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,iObj);
        if ((long)iVar1 <= (long)uVar4) break;
        piVar2 = Gia_ObjLutFanins(p,iObj);
        Vec_WrdWriteEntry(vTemp,piVar2[uVar4],*pwVar5);
        uVar4 = uVar4 + 1;
        pwVar5 = pwVar5 + 1;
      }
      if (uVar4 < 7) {
        Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
        wVar3 = Vec_WrdEntry(vTemp,iObj);
        return wVar3;
      }
      __assert_fail("i <= 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                    ,0x81,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
    }
    __assertion = "Gia_ObjIsLut(p, iObj)";
    __line = 0x7e;
  }
  else {
    __assertion = "Vec_WrdSize(vTemp) == Gia_ManObjNum(p)";
    __line = 0x7d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                ,__line,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
}

Assistant:

word Gia_ObjComputeTruthTable6Lut( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_LutForEachFanin( p, iObj, Fanin, i )
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    assert( i <= 6 );
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}